

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dimacs.h
# Opt level: O0

void Minisat::parse_DIMACS_main<Minisat::StreamBuffer,Minisat::Solver>
               (StreamBuffer *in,Solver *S,bool strictp)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int local_3c;
  int local_38;
  int cnt;
  int clauses;
  int vars;
  vec<Minisat::Lit,_int> lits;
  bool strictp_local;
  Solver *S_local;
  StreamBuffer *in_local;
  
  lits.cap._3_1_ = strictp;
  vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)&clauses);
  local_38 = 0;
  local_3c = 0;
  while( true ) {
    while( true ) {
      skipWhitespace<Minisat::StreamBuffer>(in);
      iVar2 = StreamBuffer::operator*(in);
      if (iVar2 == -1) {
        if (((lits.cap._3_1_ & 1) != 0) && (local_3c != local_38)) {
          printf("PARSE ERROR! DIMACS header mismatch: wrong number of clauses\n");
        }
        vec<Minisat::Lit,_int>::~vec((vec<Minisat::Lit,_int> *)&clauses);
        return;
      }
      iVar2 = StreamBuffer::operator*(in);
      if (iVar2 == 0x70) break;
      iVar2 = StreamBuffer::operator*(in);
      if ((iVar2 == 99) || (iVar2 = StreamBuffer::operator*(in), iVar2 == 0x70)) {
        skipLine<Minisat::StreamBuffer>(in);
      }
      else {
        local_3c = local_3c + 1;
        readClause<Minisat::StreamBuffer,Minisat::Solver>(in,S,(vec<Minisat::Lit,_int> *)&clauses);
        Solver::addClause_(S,(vec<Minisat::Lit,_int> *)&clauses);
      }
    }
    bVar1 = eagerMatch<Minisat::StreamBuffer>(in,"p cnf");
    if (!bVar1) break;
    parseInt<Minisat::StreamBuffer>(in);
    local_38 = parseInt<Minisat::StreamBuffer>(in);
  }
  uVar3 = StreamBuffer::operator*(in);
  printf("PARSE ERROR! Unexpected char: %c\n",(ulong)uVar3);
  exit(3);
}

Assistant:

static void parse_DIMACS_main(B& in, Solver& S, bool strictp = false) {
    vec<Lit> lits;
    int vars    = 0;
    int clauses = 0;
    int cnt     = 0;
    for (;;){
        skipWhitespace(in);
        if (*in == EOF) break;
        else if (*in == 'p'){
            if (eagerMatch(in, "p cnf")){
                vars    = parseInt(in);
                clauses = parseInt(in);
                // SATRACE'06 hack
                // if (clauses > 4000000)
                //     S.eliminate(true);
            }else{
                printf("PARSE ERROR! Unexpected char: %c\n", *in), exit(3);
            }
        } else if (*in == 'c' || *in == 'p')
            skipLine(in);
        else{
            cnt++;
            readClause(in, S, lits);
            S.addClause_(lits); }
    }
    if (strictp && cnt != clauses)
        printf("PARSE ERROR! DIMACS header mismatch: wrong number of clauses\n");
}